

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall
QWizardField::findProperty(QWizardField *this,QWizardDefaultProperty *properties,int propertyCount)

{
  QWizardDefaultProperty *rhs;
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QByteArray local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  if (0 < propertyCount) {
    uVar3 = 0;
    do {
      plVar2 = (long *)(*(code *)**(undefined8 **)this->object)();
      if (plVar2 != (long *)0x0) {
        rhs = properties + uVar3;
        while( true ) {
          local_40 = (char *)QMetaObject::className();
          bVar1 = ::operator==(&local_40,&rhs->className);
          if (bVar1) break;
          local_40 = (char *)QMetaObject::className();
          bVar1 = ::operator==(&local_40,&local_58);
          if ((bVar1) || (plVar2 = (long *)*plVar2, plVar2 == (long *)0x0)) goto LAB_00508d8c;
        }
        QByteArray::operator=(&local_58,&rhs->className);
        QByteArray::operator=(&this->property,&rhs->property);
        QByteArray::operator=(&this->changedSignal,&rhs->changedSignal);
      }
LAB_00508d8c:
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)propertyCount);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardField::findProperty(const QWizardDefaultProperty *properties, int propertyCount)
{
    QByteArray className;

    for (int i = 0; i < propertyCount; ++i) {
        if (objectInheritsXAndXIsCloserThanY(object, properties[i].className, className)) {
            className = properties[i].className;
            property = properties[i].property;
            changedSignal = properties[i].changedSignal;
        }
    }
}